

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void __thiscall ThreadParser::addToCheckSum(ThreadParser *this,XMLCh *chars,XMLSize_t len)

{
  int iVar1;
  XMLSize_t i;
  XMLSize_t XVar2;
  
  iVar1 = this->fCheckSum;
  if (len == 0xffffffffffffffff) {
    for (; (ushort)*chars != 0; chars = chars + 1) {
      iVar1 = iVar1 * 5 + (uint)(ushort)*chars;
      this->fCheckSum = iVar1;
    }
  }
  else {
    for (XVar2 = 0; len != XVar2; XVar2 = XVar2 + 1) {
      iVar1 = (uint)(ushort)chars[XVar2] + iVar1 * 5;
      this->fCheckSum = iVar1;
    }
  }
  return;
}

Assistant:

void ThreadParser::addToCheckSum(const XMLCh *chars, XMLSize_t len)
{
    if (len == (XMLSize_t)-1)
    {
        // Null terminated string.
        while (*chars != 0)
        {
            fCheckSum = fCheckSum*5 + *chars;
            chars++;
        }
    }
    else
    {
        // String with character count.
        XMLSize_t i;
        for (i=0; i<len; i++)
            fCheckSum = fCheckSum*5 + chars[i];
    }
}